

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npy.h
# Opt level: O2

void npy::read_magic(istream *istream,uchar *v_major,uchar *v_minor)

{
  int iVar1;
  runtime_error *this;
  char buf [8];
  
  std::istream::read((char *)istream,(long)buf);
  if (((byte)istream[*(long *)(*(long *)istream + -0x18) + 0x20] & 5) == 0) {
    iVar1 = bcmp(buf,&magic_string,6);
    if (iVar1 == 0) {
      *v_major = buf[6];
      *v_minor = buf[7];
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"this file does not have a valid npy format.");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"io error: failed reading file");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void read_magic(std::istream &istream, unsigned char &v_major, unsigned char &v_minor)
{
    char buf[magic_string_length + 2];
    istream.read(buf, magic_string_length + 2);

    if (!istream)
    {
        throw std::runtime_error("io error: failed reading file");
    }

    if (0 != std::memcmp(buf, magic_string, magic_string_length))
        throw std::runtime_error("this file does not have a valid npy format.");

    v_major = buf[magic_string_length];
    v_minor = buf[magic_string_length + 1];
}